

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalAggregate::Deserialize(LogicalAggregate *this,Deserializer *deserializer)

{
  unsigned_long group_index;
  unsigned_long aggregate_index;
  tuple<duckdb::LogicalAggregate_*,_std::default_delete<duckdb::LogicalAggregate>_> this_00;
  pointer pLVar1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  expressions;
  __uniq_ptr_impl<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>_> local_70
  ;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_68;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_48;
  
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (&local_68,deserializer,200,"expressions");
  group_index = Deserializer::ReadPropertyWithDefault<unsigned_long>
                          (deserializer,0xc9,"group_index");
  aggregate_index =
       Deserializer::ReadPropertyWithDefault<unsigned_long>(deserializer,0xca,"aggregate_index");
  this_00.
  super__Tuple_impl<0UL,_duckdb::LogicalAggregate_*,_std::default_delete<duckdb::LogicalAggregate>_>
  .super__Head_base<0UL,_duckdb::LogicalAggregate_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::LogicalAggregate_*,_std::default_delete<duckdb::LogicalAggregate>_>
       )operator_new(0xe0);
  local_48.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_68.
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_68.
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalAggregate((LogicalAggregate *)
                   this_00.
                   super__Tuple_impl<0UL,_duckdb::LogicalAggregate_*,_std::default_delete<duckdb::LogicalAggregate>_>
                   .super__Head_base<0UL,_duckdb::LogicalAggregate_*,_false>._M_head_impl,
                   group_index,aggregate_index,&local_48);
  local_70._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalAggregate_*,_std::default_delete<duckdb::LogicalAggregate>_>
  .super__Head_base<0UL,_duckdb::LogicalAggregate_*,_false>._M_head_impl =
       (tuple<duckdb::LogicalAggregate_*,_std::default_delete<duckdb::LogicalAggregate>_>)
       (tuple<duckdb::LogicalAggregate_*,_std::default_delete<duckdb::LogicalAggregate>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::LogicalAggregate_*,_std::default_delete<duckdb::LogicalAggregate>_>
       .super__Head_base<0UL,_duckdb::LogicalAggregate_*,_false>._M_head_impl;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_48);
  pLVar1 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
           ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                         *)&local_70);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0xcb,"groupings_index",&pLVar1->groupings_index);
  pLVar1 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
           ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                         *)&local_70);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (deserializer,0xcc,"groups",&pLVar1->groups);
  pLVar1 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
           ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                         *)&local_70);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,true>>
            (deserializer,0xcd,"grouping_sets",&pLVar1->grouping_sets);
  pLVar1 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
           ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                         *)&local_70);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::vector<unsigned_long,false>,true>>
            (deserializer,0xce,"grouping_functions",&pLVar1->grouping_functions);
  (this->super_LogicalOperator)._vptr_LogicalOperator =
       (_func_int **)
       local_70._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalAggregate_*,_std::default_delete<duckdb::LogicalAggregate>_>
       .super__Head_base<0UL,_duckdb::LogicalAggregate_*,_false>._M_head_impl;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_68);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalAggregate::Deserialize(Deserializer &deserializer) {
	auto expressions = deserializer.ReadPropertyWithDefault<vector<unique_ptr<Expression>>>(200, "expressions");
	auto group_index = deserializer.ReadPropertyWithDefault<idx_t>(201, "group_index");
	auto aggregate_index = deserializer.ReadPropertyWithDefault<idx_t>(202, "aggregate_index");
	auto result = duckdb::unique_ptr<LogicalAggregate>(new LogicalAggregate(group_index, aggregate_index, std::move(expressions)));
	deserializer.ReadPropertyWithDefault<idx_t>(203, "groupings_index", result->groupings_index);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<Expression>>>(204, "groups", result->groups);
	deserializer.ReadPropertyWithDefault<vector<GroupingSet>>(205, "grouping_sets", result->grouping_sets);
	deserializer.ReadPropertyWithDefault<vector<unsafe_vector<idx_t>>>(206, "grouping_functions", result->grouping_functions);
	return std::move(result);
}